

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_line_section.cpp
# Opt level: O2

ssize_t __thiscall
pstore::repo::debug_line_section_creation_dispatcher::write
          (debug_line_section_creation_dispatcher *this,int __fd,void *__buf,size_t __n)

{
  section_content *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined4 in_register_00000034;
  debug_line_section *this_00;
  sources<std::pair<pstore::pointer_based_iterator<const_unsigned_char>,_pstore::pointer_based_iterator<const_unsigned_char>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::internal_fixup_*,_std::vector<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>_>_>,_std::pair<__gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>,___gnu_cxx::__normal_iterator<const_pstore::repo::external_fixup_*,_std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_>_>_>
  local_40;
  
  this_00 = (debug_line_section *)CONCAT44(in_register_00000034,__fd);
  iVar2 = (*(this->super_section_creation_dispatcher)._vptr_section_creation_dispatcher[4])();
  if ((debug_line_section *)CONCAT44(extraout_var,iVar2) == this_00) {
    psVar1 = this->section_;
    local_40.data_range.first.pos_ = (psVar1->data).buffer_;
    local_40.data_range.second.pos_ = local_40.data_range.first.pos_ + (psVar1->data).elements_;
    local_40.ifixups_range.first._M_current =
         (psVar1->ifixups).
         super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_40.ifixups_range.second._M_current =
         (psVar1->ifixups).
         super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_40.xfixups_range.first._M_current =
         (psVar1->xfixups).
         super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_40.xfixups_range.second._M_current =
         (psVar1->xfixups).
         super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    debug_line_section::
    debug_line_section<std::pair<pstore::pointer_based_iterator<unsigned_char_const>,pstore::pointer_based_iterator<unsigned_char_const>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::internal_fixup_const*,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>>>,std::pair<__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>,__gnu_cxx::__normal_iterator<pstore::repo::external_fixup_const*,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>>>>
              (this_00,&this->header_digest_,&this->header_,&local_40,psVar1->align);
    sVar3 = debug_line_section::size_bytes(this_00);
    return (long)&(this_00->header_digest_).v_ + sVar3;
  }
  assert_failed("this->aligned (out) == out",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/mcrepo/debug_line_section.cpp"
                ,0x21);
}

Assistant:

std::uint8_t *
        debug_line_section_creation_dispatcher::write (std::uint8_t * const out) const {
            PSTORE_ASSERT (this->aligned (out) == out);
            auto * const scn = new (out) debug_line_section (
                header_digest_, header_, section_->make_sources (), section_->align);
            return out + scn->size_bytes ();
        }